

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

void accum_global_gauden_dnom
               (float32 ***dnom,float32 ***l_dnom,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float32 *pfVar4;
  float32 *pfVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (dnom == (float32 ***)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
            ,0x19e,"accum_global_gauden_dnom() called with NULL dnom\n");
    return;
  }
  if (n_lcl2glb != 0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    uVar6 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        uVar3 = lcl2glb[uVar6];
        uVar7 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            pfVar4 = l_dnom[uVar6][uVar7];
            pfVar5 = dnom[uVar3][uVar7];
            uVar8 = 0;
            do {
              pfVar5[uVar8] = (float32)((float)pfVar4[uVar8] + (float)pfVar5[uVar8]);
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar1);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != n_lcl2glb);
  }
  return;
}

Assistant:

void
accum_global_gauden_dnom(float32 ***dnom,
			 float32 ***l_dnom,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k;

    if (dnom == NULL) {
	/* nothing to do */
	E_WARN("accum_global_gauden_dnom() called with NULL dnom\n");
	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    for (ii = 0; ii < n_lcl2glb; ii++) {
	i = lcl2glb[ii];	/* find out the global id */
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		/* accumulate the local posterior into the global one */
		dnom[i][j][k] += l_dnom[ii][j][k];
	    }
	}
    }
}